

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_string_field.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::InlinedStringField::Release_abi_cxx11_(InlinedStringField *this)

{
  string *this_00;
  string *psVar1;
  string *released;
  InlinedStringField *this_local;
  
  this_00 = (string *)operator_new(0x20);
  psVar1 = get_mutable_abi_cxx11_(this);
  std::__cxx11::string::string((string *)this_00,(string *)psVar1);
  get_mutable_abi_cxx11_(this);
  std::__cxx11::string::clear();
  return this_00;
}

Assistant:

std::string* InlinedStringField::Release() {
  auto* released = new std::string(std::move(*get_mutable()));
  get_mutable()->clear();
  return released;
}